

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * pack_address_abi_cxx11_(string *__return_storage_ptr__,sockaddr_in addr)

{
  size_t sVar1;
  in_addr iVar2;
  char str_addr [1000];
  char local_3f8 [1000];
  
  iVar2 = addr.sin_addr.s_addr;
  sprintf(local_3f8,"%d.%d.%d.%d:%d",(ulong)(iVar2.s_addr & 0xff),
          (ulong)(((iVar2.s_addr & 0xff00) << 8) >> 0x10),(ulong)((iVar2.s_addr & 0xff0000) >> 0x10)
          ,(ulong)(iVar2.s_addr >> 0x18),(uint)(ushort)(addr.sin_port << 8 | addr.sin_port >> 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_3f8);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_3f8,local_3f8 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string pack_address(struct sockaddr_in addr) {
    char str_addr[ADDRESS_MAX_SIZE];
    uint32_t ip = ntohl(addr.sin_addr.s_addr);
    unsigned short port = ntohs(addr.sin_port);
    sprintf(str_addr, "%d.%d.%d.%d:%d",
            (ip & 0xff000000) >> 24,
            (ip & 0x00ff0000) >> 16,
            (ip & 0x0000ff00) >> 8,
            (ip & 0x000000ff), port);

    return std::string(str_addr);
}